

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O3

void Kernel::InferenceStore::Smt2ProofCheckPrinter::outputQuoted(ostream *out,string *name)

{
  int iVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  char *pcVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)name);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)name);
              if (iVar1 != 0) {
                pcVar3 = (name->_M_dataplus)._M_p;
                if ((*pcVar3 == '\'') || (*pcVar3 == '$')) {
                  uStack_18 = CONCAT17(0x7c,(undefined7)uStack_18);
                  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                     (out,(char *)((long)&uStack_18 + 7),1);
                  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
                  return;
                }
                goto LAB_0052ca10;
              }
            }
          }
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"_",1);
  pcVar3 = (name->_M_dataplus)._M_p;
LAB_0052ca10:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,name->_M_string_length);
  return;
}

Assistant:

static void outputQuoted(std::ostream& out, std::string const& name) 
  {
    if (   name == "exp"
        || name == "log"
        || name == "cos"
        || name == "sin"
        || name == "tan"
        || name == "sqrt"
        || name == "const"
        ) {
        out << "_" << name;
    } else if ( name[0] == '\'' || name[0] == '$') {
      // add one more level of quoting
      out << '|' << name << "|";
    } else  {
      out << name;
    }
  }